

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O3

string * __thiscall
duckdb::ExtensionRepository::ToReadableString_abi_cxx11_
          (string *__return_storage_ptr__,ExtensionRepository *this)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  sVar1 = (this->name)._M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->path)._M_dataplus._M_p;
    pcVar2 = pcVar3 + (this->path)._M_string_length;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->name)._M_dataplus._M_p;
    pcVar2 = pcVar3 + sVar1;
  }
  ::std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string ExtensionRepository::ToReadableString() {
	if (!name.empty()) {
		return name;
	}
	return path;
}